

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ListBox(char *label,int *current_item,_func_bool_void_ptr_int_char_ptr_ptr *items_getter
                   ,void *data,int items_count,int height_in_items)

{
  bool bVar1;
  undefined8 in_RCX;
  code *in_RDX;
  int *in_RSI;
  int in_R8D;
  int in_R9D;
  float fVar2;
  bool item_selected;
  char *item_text;
  int i;
  bool in_stack_00000037;
  char *in_stack_00000038;
  ImGuiListClipper clipper;
  bool value_changed;
  ImVec2 size;
  float height_in_items_f;
  ImGuiContext *g;
  ImGuiListClipper *in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff74;
  float in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  uint uVar3;
  ImGuiListClipper *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  ImGuiListClipper local_64;
  byte local_45;
  ImVec2 local_44;
  float local_3c;
  ImGuiContext *local_38;
  int local_30;
  undefined8 local_28;
  code *local_20;
  int *local_18;
  byte local_1;
  
  local_38 = GImGui;
  local_30 = in_R9D;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  if (in_R9D < 0) {
    local_30 = ImMin<int>(in_R8D,7);
  }
  local_3c = (float)local_30 + 0.25;
  fVar2 = GetTextLineHeightWithSpacing();
  fVar2 = ImFloor(fVar2 * local_3c + (local_38->Style).FramePadding.y * 2.0);
  ImVec2::ImVec2(&local_44,0.0,fVar2);
  bVar1 = BeginListBox((char *)clipper._20_8_,(ImVec2 *)clipper._12_8_);
  if (bVar1) {
    local_45 = 0;
    ImGuiListClipper::ImGuiListClipper(in_stack_ffffffffffffff60);
    GetTextLineHeightWithSpacing();
    ImGuiListClipper::Begin
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
    while (bVar1 = ImGuiListClipper::Step
                             ((ImGuiListClipper *)
                              CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)),
          in_stack_ffffffffffffff88 = local_64.DisplayStart, bVar1) {
      for (; in_stack_ffffffffffffff88 < local_64.DisplayEnd;
          in_stack_ffffffffffffff88 = in_stack_ffffffffffffff88 + 1) {
        (*local_20)(local_28,in_stack_ffffffffffffff88,&stack0xffffffffffffff80);
        PushID((int)in_stack_ffffffffffffff74);
        uVar3 = (uint)(in_stack_ffffffffffffff88 == *local_18) << 0x18;
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff74,0.0,0.0);
        bVar1 = Selectable(in_stack_00000038,in_stack_00000037,i,(ImVec2 *)item_text);
        if (bVar1) {
          *local_18 = in_stack_ffffffffffffff88;
          local_45 = 1;
        }
        if ((uVar3 & 0x1000000) != 0) {
          SetItemDefaultFocus();
        }
        PopID();
      }
    }
    EndListBox();
    if ((local_45 & 1) != 0) {
      MarkItemEdited((local_38->CurrentWindow->DC).LastItemId);
    }
    local_1 = local_45 & 1;
    ImGuiListClipper::~ImGuiListClipper(&local_64);
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool ImGui::ListBox(const char* label, int* current_item, bool (*items_getter)(void*, int, const char**), void* data, int items_count, int height_in_items)
{
    ImGuiContext& g = *GImGui;

    // Calculate size from "height_in_items"
    if (height_in_items < 0)
        height_in_items = ImMin(items_count, 7);
    float height_in_items_f = height_in_items + 0.25f;
    ImVec2 size(0.0f, ImFloor(GetTextLineHeightWithSpacing() * height_in_items_f + g.Style.FramePadding.y * 2.0f));

    if (!BeginListBox(label, size))
        return false;

    // Assume all items have even height (= 1 line of text). If you need items of different height,
    // you can create a custom version of ListBox() in your code without using the clipper.
    bool value_changed = false;
    ImGuiListClipper clipper;
    clipper.Begin(items_count, GetTextLineHeightWithSpacing()); // We know exactly our line height here so we pass it as a minor optimization, but generally you don't need to.
    while (clipper.Step())
        for (int i = clipper.DisplayStart; i < clipper.DisplayEnd; i++)
        {
            const char* item_text;
            if (!items_getter(data, i, &item_text))
                item_text = "*Unknown item*";

            PushID(i);
            const bool item_selected = (i == *current_item);
            if (Selectable(item_text, item_selected))
            {
                *current_item = i;
                value_changed = true;
            }
            if (item_selected)
                SetItemDefaultFocus();
            PopID();
        }
    EndListBox();
    if (value_changed)
        MarkItemEdited(g.CurrentWindow->DC.LastItemId);

    return value_changed;
}